

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

bool __thiscall lan::db::str_compare(db *this,char target,string *content)

{
  ulong uVar1;
  long lVar2;
  ulong local_30;
  register_t i;
  string *content_local;
  char target_local;
  db *this_local;
  
  local_30 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= local_30) {
      return false;
    }
    lVar2 = std::__cxx11::string::data();
    if (*(char *)(lVar2 + local_30) == target) break;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool db::str_compare(const char target, const std::string content){
            for(register_t i = 0 ; i < content.length() ; i++)
                if(content.data()[i] == target)
                    return true;
                return false;
        }